

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall pugi::xml_node::prepend_attribute(xml_node *this,char_t *name_)

{
  xml_node_struct *pxVar1;
  xml_attribute xVar2;
  uint uVar3;
  xml_allocator *alloc;
  xml_attribute_struct *pxVar4;
  xml_attribute a;
  xml_attribute local_28;
  xml_attribute local_20;
  
  pxVar1 = this->_root;
  if ((pxVar1 != (xml_node_struct *)0x0) &&
     ((uVar3 = (uint)pxVar1->header & 0xf, uVar3 == 2 || (uVar3 == 7)))) {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(pxVar1);
    pxVar4 = impl::anon_unknown_0::allocate_attribute(alloc);
    xml_attribute::xml_attribute(&local_20,pxVar4);
    if (local_20._attr != (xml_attribute_struct *)0x0) {
      pxVar1 = this->_root;
      pxVar4 = pxVar1->first_attribute;
      xVar2._attr = local_20._attr;
      if (pxVar4 != (xml_attribute_struct *)0x0) {
        (local_20._attr)->prev_attribute_c = pxVar4->prev_attribute_c;
        xVar2._attr = pxVar4;
      }
      (xVar2._attr)->prev_attribute_c = local_20._attr;
      (local_20._attr)->next_attribute = pxVar4;
      pxVar1->first_attribute = local_20._attr;
      xml_attribute::set_name(&local_20,name_);
      return (xml_attribute)local_20._attr;
    }
  }
  xml_attribute::xml_attribute(&local_28);
  return (xml_attribute)local_28._attr;
}

Assistant:

PUGI_IMPL_FN xml_attribute xml_node::prepend_attribute(const char_t* name_)
	{
		if (!impl::allow_insert_attribute(type())) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::prepend_attribute(a._attr, _root);

		a.set_name(name_);

		return a;
	}